

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorspace.h
# Opt level: O3

RGB __thiscall pbrt::RGBColorSpace::ToRGB(RGBColorSpace *this,XYZ *xyz)

{
  Float *pFVar1;
  undefined1 auVar2 [16];
  XYZ *pXVar3;
  SquareMatrix<3> *pSVar4;
  int i;
  int iVar5;
  long lVar6;
  int j;
  Float *pFVar7;
  long lVar8;
  RGB RVar9;
  Float local_1c;
  undefined8 local_18;
  
  pSVar4 = &this->RGBFromXYZ;
  lVar6 = 0;
  local_18 = 0;
  local_1c = 0.0;
  do {
    iVar5 = (int)lVar6;
    pFVar7 = (Float *)&local_18;
    if ((iVar5 != 0) && (pFVar7 = (Float *)((long)&local_18 + 4), iVar5 != 1)) {
      pFVar7 = &local_1c;
    }
    *pFVar7 = 0.0;
    lVar8 = 0;
    do {
      pXVar3 = xyz;
      if (((int)lVar8 != 0) && (pXVar3 = (XYZ *)&xyz->Y, (int)lVar8 != 1)) {
        pXVar3 = (XYZ *)&xyz->Z;
      }
      pFVar7 = (Float *)&local_18;
      if ((iVar5 != 0) && (pFVar7 = (Float *)((long)&local_18 + 4), iVar5 != 1)) {
        pFVar7 = &local_1c;
      }
      pFVar1 = pSVar4->m[0] + lVar8;
      lVar8 = lVar8 + 1;
      auVar2 = vfmadd213ss_fma(ZEXT416((uint)pXVar3->X),ZEXT416((uint)*pFVar1),
                               ZEXT416((uint)*pFVar7));
      *pFVar7 = auVar2._0_4_;
    } while (lVar8 != 3);
    lVar6 = lVar6 + 1;
    pSVar4 = (SquareMatrix<3> *)(pSVar4->m + 1);
  } while (lVar6 != 3);
  RVar9.b = local_1c;
  RVar9.r = (Float)(undefined4)local_18;
  RVar9.g = (Float)local_18._4_4_;
  return RVar9;
}

Assistant:

PBRT_CPU_GPU
    RGB ToRGB(const XYZ &xyz) const { return Mul<RGB>(RGBFromXYZ, xyz); }